

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDComponentList::CreateFromVertexList
          (ON_SubDComponentList *this,ON_SubD *subd,ON_SimpleArray<ON_SubDVertexPtr> *vertex_list)

{
  bool bVar1;
  uint uVar2;
  uint marked_component_count;
  ulong uVar3;
  ON_ComponentStatus *this_00;
  uint i;
  ulong uVar4;
  ON_SubDComponentMarksClearAndRestore saved_marks;
  
  ON_SubDComponentMarksClearAndRestore::ON_SubDComponentMarksClearAndRestore(&saved_marks,subd);
  uVar2 = *(uint *)(vertex_list + 0x10);
  marked_component_count = 0;
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    uVar3 = *(ulong *)(*(long *)(vertex_list + 8) + uVar4 * 8) & 0xfffffffffffffff8;
    if (uVar3 != 0) {
      this_00 = (ON_ComponentStatus *)(uVar3 + 0x10);
      bVar1 = ON_ComponentStatus::RuntimeMark(this_00);
      if (!bVar1) {
        ON_ComponentStatus::SetRuntimeMark(this_00);
        marked_component_count = marked_component_count + 1;
      }
    }
  }
  uVar2 = Internal_Create(this,subd,true,false,false,true,marked_component_count);
  ON_SubDComponentMarksClearAndRestore::~ON_SubDComponentMarksClearAndRestore(&saved_marks);
  return uVar2;
}

Assistant:

unsigned ON_SubDComponentList::CreateFromVertexList(const ON_SubD& subd, const ON_SimpleArray<ON_SubDVertexPtr>& vertex_list)
{
  ON_SubDComponentMarksClearAndRestore saved_marks(subd);
  const unsigned count = vertex_list.UnsignedCount();
  unsigned marked_count = 0;
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_SubDVertex* v = vertex_list[i].Vertex();
    if (nullptr == v)
      continue;
    if (v->m_status.RuntimeMark())
      continue;
    v->m_status.SetRuntimeMark();
    ++marked_count;
  }
  return Internal_Create(subd, true, false, false, true, marked_count);
}